

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall
Minisat::Solver::simplifyLearnt(Solver *this,vec<unsigned_int> *target_learnts,bool is_tier2)

{
  bool bVar1;
  lbool lVar2;
  int iVar3;
  int iVar4;
  CRef CVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  ClauseRingBuffer *this_00;
  Lit *pLVar9;
  byte in_DL;
  vec<unsigned_int> *in_RSI;
  Clause *in_RDI;
  Solver *unaff_retaddr;
  bool recentDuplicate;
  int i;
  int saved_size;
  Clause *c;
  CRef cr;
  bool ret;
  int nbSimplifing;
  int nbSimplified;
  int nblevels;
  bool false_lit;
  bool sat;
  int lj;
  int li;
  int cj;
  int ci;
  Solver *in_stack_000001a0;
  uint in_stack_ffffffffffffff48;
  Ref in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar10;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  CRef in_stack_ffffffffffffff5c;
  ClauseRingBuffer *in_stack_ffffffffffffff60;
  uchar op;
  Solver *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  lbool local_69 [4];
  bool bVar11;
  CRef in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa4;
  lbool in_stack_ffffffffffffffa6;
  lbool in_stack_ffffffffffffffa7;
  lbool local_51;
  int local_50;
  int local_4c;
  ClauseRingBuffer *this_01;
  CRef in_stack_ffffffffffffffc0;
  undefined3 in_stack_ffffffffffffffc8;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  Lit in_stack_ffffffffffffffd4;
  undefined2 in_stack_ffffffffffffffd8;
  byte bVar15;
  undefined1 strict;
  CRef in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int local_18;
  Clause *c_00;
  
  iVar14 = 0;
  iVar13 = 0;
  uVar12 = CONCAT13(1,in_stack_ffffffffffffffc8);
  local_18 = 0;
  iVar7 = 0;
  c_00 = in_RDI;
  do {
    iVar3 = vec<unsigned_int>::size(in_RSI);
    if (iVar3 <= local_18) goto LAB_0012f7b1;
    puVar8 = vec<unsigned_int>::operator[](in_RSI,local_18);
    uVar10 = *puVar8;
    this_00 = (ClauseRingBuffer *)
              ClauseAllocator::operator[]
                        ((ClauseAllocator *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff4c);
    bVar1 = removed((Solver *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff4c);
    iVar3 = iVar7;
    if ((!bVar1) && (iVar4 = Clause::size((Clause *)this_00), iVar3 = iVar7, iVar4 != 1)) {
      bVar1 = Clause::simplified((Clause *)this_00);
      if (bVar1) {
        puVar8 = vec<unsigned_int>::operator[](in_RSI,local_18);
        uVar10 = *puVar8;
        iVar3 = iVar7 + 1;
        puVar8 = vec<unsigned_int>::operator[](in_RSI,iVar7);
        *puVar8 = uVar10;
        iVar14 = iVar14 + 1;
      }
      else {
        local_4c = Clause::size((Clause *)this_00);
        iVar13 = iVar13 + 1;
        bVar15 = 0;
        strict = 0;
        local_50 = 0;
        while (iVar4 = local_50, iVar3 = Clause::size((Clause *)this_00), iVar4 < iVar3) {
          Clause::operator[]((Clause *)this_00,local_50);
          local_51 = value((Solver *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           (Lit)(int)in_stack_ffffffffffffff60);
          lbool::lbool((lbool *)&stack0xffffffffffffffa7,'\0');
          bVar1 = lbool::operator==(&local_51,in_stack_ffffffffffffffa7);
          if (bVar1) {
            strict = true;
            break;
          }
          pLVar9 = Clause::operator[]((Clause *)this_00,local_50);
          in_stack_ffffffffffffffa0 = pLVar9->x;
          in_stack_ffffffffffffffa6 =
               value((Solver *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (Lit)(int)in_stack_ffffffffffffff60);
          lbool::lbool((lbool *)&stack0xffffffffffffff9f,'\x01');
          bVar1 = lbool::operator==((lbool *)&stack0xffffffffffffffa6,
                                    (lbool)(uint8_t)(in_stack_ffffffffffffff9c >> 0x18));
          if (bVar1) {
            bVar15 = 1;
          }
          local_50 = local_50 + 1;
        }
        iVar3 = stack0xffffffffffffff98;
        if ((strict & 1) == 0) {
          detachClause((Solver *)CONCAT44(iVar7,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
                       ,(bool)strict);
          if ((bVar15 & 1) != 0) {
            in_stack_ffffffffffffffdc = 0;
            in_stack_ffffffffffffff78 = 0;
            while (in_stack_ffffffffffffffe0 = in_stack_ffffffffffffff78,
                  iVar3 = Clause::size((Clause *)this_00), in_stack_ffffffffffffff78 < iVar3) {
              pLVar9 = Clause::operator[]((Clause *)this_00,in_stack_ffffffffffffffe0);
              unique0x00011f80 = pLVar9->x;
              lVar2 = value((Solver *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (Lit)(int)in_stack_ffffffffffffff60);
              in_stack_ffffffffffffff9c =
                   CONCAT13((uint8_t)(in_stack_ffffffffffffff9c >> 0x18),
                            CONCAT12(lVar2.value,(short)in_stack_ffffffffffffff9c));
              lbool::lbool(local_69,'\x01');
              bVar1 = lbool::operator!=((lbool *)CONCAT44(in_stack_ffffffffffffff4c,
                                                          in_stack_ffffffffffffff48),
                                        (lbool)(uint8_t)((uint)in_stack_ffffffffffffff54 >> 0x18));
              if (bVar1) {
                in_stack_ffffffffffffff70 =
                     (Solver *)Clause::operator[]((Clause *)this_00,in_stack_ffffffffffffffe0);
                CVar5 = in_stack_ffffffffffffffdc + 1;
                pLVar9 = Clause::operator[]((Clause *)this_00,in_stack_ffffffffffffffdc);
                pLVar9->x = *(int *)&in_stack_ffffffffffffff70->_vptr_Solver;
                in_stack_ffffffffffffffdc = CVar5;
              }
              in_stack_ffffffffffffff78 = in_stack_ffffffffffffffe0 + 1;
            }
            Clause::shrink((Clause *)this_00,in_stack_ffffffffffffffe0 - in_stack_ffffffffffffffdc);
            Clause::S((Clause *)this_00,0);
          }
          simplifyLearnt<Minisat::Clause>(unaff_retaddr,c_00);
          bVar1 = isSimplifyDuplicate((Solver *)
                                      CONCAT44(in_stack_ffffffffffffffdc,
                                               CONCAT13(strict,CONCAT12(bVar15,
                                                  in_stack_ffffffffffffffd8))),
                                      in_stack_ffffffffffffffd4.x);
          iVar3 = stack0xffffffffffffff98;
          if (bVar1) {
            bVar11 = SUB41((uint)stack0xffffffffffffff98 >> 0x18,0);
            bVar1 = bVar11;
            unique0x10000804 = iVar3;
            removeSatisfiedClause
                      ((Solver *)
                       CONCAT17(in_stack_ffffffffffffffa7.value,
                                CONCAT16(in_stack_ffffffffffffffa6.value,
                                         CONCAT24(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0))),
                       in_stack_ffffffffffffff9c,bVar1);
            Clause::mark((Clause *)this_00,1);
            in_RDI[0xd8].header = in_RDI[0xd8].header + 1;
            iVar3 = iVar7;
          }
          else {
            iVar3 = local_4c;
            iVar6 = Clause::size((Clause *)this_00);
            this_01 = this_00;
            if (iVar3 != iVar6) {
              Clause::lbd((Clause *)this_00);
              op = (uchar)((uint)iVar3 >> 0x18);
              shareViaCallback<Minisat::Clause>
                        ((Solver *)CONCAT44(in_stack_ffffffffffffffd4.x,iVar14),
                         (Clause *)CONCAT44(iVar13,uVar12),uVar10);
              in_stack_ffffffffffffff60 = this_00;
              if (in_RDI[5].header != (anon_struct_8_10_eb538618_for_header)0x0) {
                binDRUP<Minisat::Clause>
                          (in_stack_ffffffffffffff70,op,(Clause *)this_00,
                           (FILE *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
                in_stack_ffffffffffffff60 = this_00;
              }
            }
            iVar3 = Clause::size((Clause *)this_01);
            if (iVar3 == 0) {
              *(undefined1 *)&in_RDI[0x45].header = 0;
              uVar12 = 0;
              while( true ) {
                local_18 = local_18 + 1;
                iVar14 = local_18;
                iVar13 = vec<unsigned_int>::size(in_RSI);
                if (iVar13 <= iVar14) break;
                puVar8 = vec<unsigned_int>::operator[](in_RSI,local_18);
                uVar10 = *puVar8;
                iVar14 = iVar7 + 1;
                puVar8 = vec<unsigned_int>::operator[](in_RSI,iVar7);
                *puVar8 = uVar10;
                iVar7 = iVar14;
              }
LAB_0012f7b1:
              bVar15 = (byte)((uint)uVar12 >> 0x18);
              vec<unsigned_int>::shrink(in_RSI,local_18 - iVar7);
              return (bool)(bVar15 & 1);
            }
            iVar3 = Clause::size((Clause *)this_01);
            if (iVar3 == 1) {
              Clause::operator[]((Clause *)this_01,0);
              uncheckedEnqueue((Solver *)CONCAT44(iVar13,uVar12),in_stack_ffffffffffffffd4,uVar10,
                               in_stack_ffffffffffffffc0);
              Clause::mark((Clause *)this_01,1);
              CVar5 = propagate(in_stack_000001a0);
              if (CVar5 != 0xffffffff) {
                *(undefined1 *)&in_RDI[0x45].header = 0;
                uVar12 = 0;
                while( true ) {
                  local_18 = local_18 + 1;
                  iVar14 = local_18;
                  iVar13 = vec<unsigned_int>::size(in_RSI);
                  if (iVar13 <= iVar14) break;
                  puVar8 = vec<unsigned_int>::operator[](in_RSI,local_18);
                  uVar10 = *puVar8;
                  iVar14 = iVar7 + 1;
                  puVar8 = vec<unsigned_int>::operator[](in_RSI,iVar7);
                  *puVar8 = uVar10;
                  iVar7 = iVar14;
                }
                goto LAB_0012f7b1;
              }
              ClauseAllocator::free((ClauseAllocator *)(in_RDI + 0xa1),(void *)(ulong)uVar10);
              iVar3 = iVar7;
            }
            else {
              attachClause((Solver *)CONCAT44(uVar10,in_stack_ffffffffffffffc0),
                           (CRef)((ulong)this_01 >> 0x20));
              puVar8 = vec<unsigned_int>::operator[](in_RSI,local_18);
              in_stack_ffffffffffffff48 = *puVar8;
              iVar3 = iVar7 + 1;
              puVar8 = vec<unsigned_int>::operator[](in_RSI,iVar7);
              *puVar8 = in_stack_ffffffffffffff48;
              ClauseRingBuffer::addNext(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
              in_stack_ffffffffffffff4c =
                   computeLBD<Minisat::Clause>
                             ((Solver *)CONCAT44(iVar4,in_stack_ffffffffffffff78),
                              (Clause *)in_stack_ffffffffffffff70);
              in_stack_ffffffffffffffd4.x = in_stack_ffffffffffffff4c;
              iVar7 = Clause::lbd((Clause *)this_01);
              if ((int)in_stack_ffffffffffffff4c < iVar7) {
                Clause::set_lbd((Clause *)this_01,in_stack_ffffffffffffffd4.x);
              }
              if (((in_DL & 1) != 0) &&
                 (iVar7 = Clause::lbd((Clause *)this_01), iVar7 <= *(int *)&in_RDI[0x97].header)) {
                iVar3 = iVar3 + -1;
                vec<unsigned_int>::push
                          ((vec<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (uint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
                Clause::mark((Clause *)this_01,3);
              }
              Clause::setSimplified((Clause *)this_01,true);
            }
          }
        }
        else {
          bVar11 = SUB41((uint)stack0xffffffffffffff98 >> 0x18,0);
          bVar1 = bVar11;
          unique0x10000808 = iVar3;
          removeSatisfiedClause
                    ((Solver *)
                     CONCAT17(in_stack_ffffffffffffffa7.value,
                              CONCAT16(in_stack_ffffffffffffffa6.value,
                                       CONCAT24(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                      )),in_stack_ffffffffffffff9c,bVar1);
          iVar3 = iVar7;
        }
      }
    }
    local_18 = local_18 + 1;
    iVar7 = iVar3;
  } while( true );
}

Assistant:

bool Solver::simplifyLearnt(vec<CRef> &target_learnts, bool is_tier2)
{
    int ci, cj, li, lj;
    bool sat, false_lit;
    int nblevels;
    ////
    ////
    int nbSimplified = 0;
    int nbSimplifing = 0;

    bool ret = true;

    for (ci = 0, cj = 0; ci < target_learnts.size(); ci++) {
        CRef cr = target_learnts[ci];
        Clause &c = ca[cr];

        if (removed(cr) || c.size() == 1)
            continue;
        else if (c.simplified()) {
            target_learnts[cj++] = target_learnts[ci];
            ////
            nbSimplified++;
        } else {
            int saved_size = c.size();
            /* DRUP: in case we want a correct proof, i.e. track all simplifications,
               we would need to keep track of the original clause here. Let's skip this
               for efficiency. */
            //         if (drup_file){
            //                 add_oc.clear();
            //                 for (int i = 0; i < c.size(); i++) add_oc.push(c[i]); }
            ////
            nbSimplifing++;
            sat = false_lit = false;
            for (int i = 0; i < c.size(); i++) {
                if (value(c[i]) == l_True) {
                    sat = true;
                    break;
                } else if (value(c[i]) == l_False) {
                    false_lit = true;
                }
            }
            if (sat) {
                removeSatisfiedClause(cr);
            } else {
                detachClause(cr, true);

                if (false_lit) {
                    for (li = lj = 0; li < c.size(); li++) {
                        if (value(c[li]) != l_False) {
                            c[lj++] = c[li];
                        }
                    }
                    c.shrink(li - lj);
                    TRACE(std::cout << "c dropped" << li - lj << " literals from clause [" << cr << "]: " << c << std::endl);
                    c.S(0); // this clause might subsume others now
                }

                assert(c.size() > 1);
                // simplify a learnt clause c
                TRACE(std::cout << "c LCM simplify clause[" << cr << "]: " << c << std::endl);
                simplifyLearnt(c);

                bool recentDuplicate = isSimplifyDuplicate(cr);

                if (!recentDuplicate) {

                    TRACE(std::cout << "c LCM keep (simplified?) clause[" << cr << "]: " << c << std::endl);

                    if (saved_size != c.size()) {
                        shareViaCallback(c, c.lbd()); // share via IPASIR?

                        // print to proof
                        if (drup_file) {
#ifdef BIN_DRUP
                            binDRUP('a', c, drup_file);
                            //                    binDRUP('d', add_oc, drup_file);
#else
                            for (int i = 0; i < c.size(); i++)
                                fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
                            fprintf(drup_file, "0\n");

                            //                    fprintf(drup_file, "d ");
                            //                    for (int i = 0; i < add_oc.size(); i++)
                            //                        fprintf(drup_file, "%i ", (var(add_oc[i]) + 1) * (-2 * sign(add_oc[i]) + 1));
                            //                    fprintf(drup_file, "0\n");
#endif
                        }
                    }

                    if (c.size() == 0) {
                        ok = false;
                        ret = false;
                        ci++;
                        while (ci < target_learnts.size()) target_learnts[cj++] = target_learnts[ci++];
                        goto simplifyLearnt_out;
                    } else if (c.size() == 1) {
                        // when unit clause occur, enqueue and propagate
                        uncheckedEnqueue(c[0], 0);
                        c.mark(1);
                        if (propagate() != CRef_Undef) {
                            ok = false;
                            ret = false;
                            ci++;
                            while (ci < target_learnts.size()) target_learnts[cj++] = target_learnts[ci++];
                            goto simplifyLearnt_out;
                        }
                        // delete the clause memory in logic
                        ca.free(cr);
                        /* DRUP: in case we want a correct proof, i.e. track all simplifications,
                        we would need to keep track of the original clause here. Let's skip this
                        for efficiency. */
                        //#ifdef BIN_DRUP
                        //                    binDRUP('d', c, drup_file);
                        //#else
                        //                    fprintf(drup_file, "d ");
                        //                    for (int i = 0; i < c.size(); i++)
                        //                        fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
                        //                    fprintf(drup_file, "0\n");
                        //#endif
                    } else {
                        attachClause(cr);
                        target_learnts[cj++] = target_learnts[ci];
                        simplifyBuffer.addNext(cr); /* store in duplicate buffer */

                        nblevels = computeLBD(c);
                        if (nblevels < c.lbd()) {
                            c.set_lbd(nblevels);
                        }

                        // in case we work on the tier2 set, a clause might move to core learnt clauses
                        if (is_tier2 && c.lbd() <= core_lbd_cut) {
                            cj--;
                            learnts_core.push(cr);
                            c.mark(CORE);
                        }

                        c.setSimplified(true);
                    }

                } else {
                    TRACE(std::cout << "c LCM: drop duplicate simplified clause[" << cr << "]: " << ca[cr] << std::endl);
                    // this clause is a duplicate now, hence, mark it accordingly
                    /* DRUP: do not delete this simplified clause from the proof, as we did not add it yet */
                    removeSatisfiedClause(cr, false);
                    c.mark(1);
                    nr_lcm_duplicates++;
                }
            }
        }
    }
simplifyLearnt_out:;
    target_learnts.shrink(ci - cj);

    return ret;
}